

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

VMapEntry *
FindEntry<Assimp::LWO::VColorChannel>
          (vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_> *list,
          string *name,bool perPoly)

{
  VMapEntry *pVVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  pointer pVVar3;
  int iVar4;
  Logger *this;
  VMapEntry *pVVar5;
  VMapEntry local_a0;
  
  pVVar5 = &((list->
             super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
             )._M_impl.super__Vector_impl_data._M_start)->super_VMapEntry;
  pVVar1 = &((list->
             super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
             )._M_impl.super__Vector_impl_data._M_finish)->super_VMapEntry;
  if (pVVar5 != pVVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    do {
      __n = (pVVar5->name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          if (perPoly) {
            return pVVar5;
          }
LAB_003de89b:
          this = Assimp::DefaultLogger::get();
          Assimp::Logger::warn(this,"LWO2: Found two VMAP sections with equal names");
          return pVVar5;
        }
        iVar4 = bcmp((pVVar5->name)._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0 && !perPoly) goto LAB_003de89b;
        if (iVar4 == 0) {
          return pVVar5;
        }
      }
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar1);
  }
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  local_a0.name._M_string_length = 0;
  local_a0.name.field_2._M_local_buf[0] = '\0';
  local_a0.dims = 4;
  local_a0.abAssigned.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.abAssigned.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_a0.abAssigned.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_a0.rawData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_a0.rawData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_a0.rawData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_a0.abAssigned.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.abAssigned.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_a0._vptr_VMapEntry = (_func_int **)&PTR__VMapEntry_007df5f0;
  std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::
  emplace_back<Assimp::LWO::VColorChannel>(list,(VColorChannel *)&local_a0);
  Assimp::LWO::VMapEntry::~VMapEntry(&local_a0);
  pVVar3 = (list->
           super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)&pVVar3[-1].super_VMapEntry.name);
  return &pVVar3[-1].super_VMapEntry;
}

Assistant:

VMapEntry* FindEntry(std::vector< T >& list,const std::string& name, bool perPoly)
{
    for (auto & elem : list)   {
        if (elem.name == name) {
            if (!perPoly)   {
                ASSIMP_LOG_WARN("LWO2: Found two VMAP sections with equal names");
            }
            return &elem;
        }
    }
    list.push_back( T() );
    VMapEntry* p = &list.back();
    p->name = name;
    return p;
}